

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O2

apx_error_t
apx_vm_serializer_check_value_range_uint64
          (apx_vm_serializer_t *self,uint64_t lower_limit,uint64_t upper_limit)

{
  apx_error_t aVar1;
  int32_t iVar2;
  apx_vm_writeState_t *paVar3;
  int index;
  
  if (self == (apx_vm_serializer_t *)0x0) {
    aVar1 = 1;
  }
  else {
    paVar3 = self->state;
    if (paVar3->value_type == DTL_DV_ARRAY) {
      iVar2 = dtl_av_length((paVar3->value).av);
      self->state->range_check_state = '\x01';
      index = 0;
      do {
        if (iVar2 == index) {
          return 0;
        }
        aVar1 = state_read_scalar_array_value(self->state,index,'\x04');
        paVar3 = self->state;
        if (aVar1 != 0) goto LAB_00133763;
        if (paVar3->scalar_storage_type != '\x04') {
          __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                        ,0x301,
                        "apx_error_t apx_vm_serializer_check_value_range_uint64(apx_vm_serializer_t *, uint64_t, uint64_t)"
                       );
        }
        aVar1 = apx_vm_value_in_range_u64((paVar3->scalar_value).u64,lower_limit,upper_limit);
        index = index + 1;
      } while (aVar1 == 0);
      paVar3 = self->state;
LAB_00133763:
      paVar3->range_check_state = '\x02';
    }
    else if (paVar3->value_type == DTL_DV_SCALAR) {
      aVar1 = state_read_scalar_value(paVar3,'\x04');
      paVar3 = self->state;
      if (aVar1 == 0) {
        if (paVar3->scalar_storage_type != '\x04') {
          __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                        ,0x2e7,
                        "apx_error_t apx_vm_serializer_check_value_range_uint64(apx_vm_serializer_t *, uint64_t, uint64_t)"
                       );
        }
        aVar1 = apx_vm_value_in_range_u64((paVar3->scalar_value).u64,lower_limit,upper_limit);
        paVar3 = self->state;
        if (aVar1 == 0) {
          paVar3->range_check_state = '\x01';
          return 0;
        }
      }
      paVar3->range_check_state = '\x02';
    }
    else {
      aVar1 = 10;
    }
  }
  return aVar1;
}

Assistant:

apx_error_t apx_vm_serializer_check_value_range_uint64(apx_vm_serializer_t* self, uint64_t lower_limit, uint64_t upper_limit)
{
   if (self != NULL)
   {
      apx_error_t retval = APX_NO_ERROR;
      if (self->state->value_type == DTL_DV_SCALAR)
      {
         retval = state_read_scalar_value(self->state, APX_TYPE_CODE_UINT64);
         if (retval == APX_NO_ERROR)
         {
            assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64);
            retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
            if (retval == APX_NO_ERROR)
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
            }
         }
         else
         {
            self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
         }
      }
      else if (self->state->value_type == DTL_DV_ARRAY)
      {
         uint32_t i;
         uint32_t length = (uint32_t)dtl_av_length(self->state->value.av);
         self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
         for (i = 0u; i < length; i++)
         {
            retval = state_read_scalar_array_value(self->state, i, APX_TYPE_CODE_UINT64);
            if (retval == APX_NO_ERROR)
            {
               assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64);
               retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
               if (retval != APX_NO_ERROR)
               {
                  self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
                  break;
               }
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
               break;
            }
         }
      }
      else
      {
         retval = APX_UNSUPPORTED_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}